

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::file_mapping::file_mapping
          (file_mapping *this,file_handle *file,open_mode_t mode,int64_t file_size)

{
  size_t __len;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int __flags;
  handle_type __fd;
  int64_t iVar4;
  int *piVar5;
  error_category *cat;
  void *local_c0;
  uint local_7c;
  uint local_78;
  operation_t local_71;
  int advise;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined4 local_48;
  uint local_44;
  uint local_40 [5];
  uint local_2c;
  int64_t local_28;
  int64_t file_size_local;
  file_handle *file_local;
  file_mapping *this_local;
  open_mode_t mode_local;
  
  local_28 = file_size;
  file_size_local = (int64_t)file;
  file_local = (file_handle *)this;
  this_local._4_4_ = mode.m_val;
  ::std::enable_shared_from_this<libtorrent::aux::file_mapping>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libtorrent::aux::file_mapping>);
  local_2c = this_local._4_4_;
  iVar4 = anon_unknown_9::memory_map_size(this_local._4_4_,local_28,file);
  this->m_size = iVar4;
  file_handle::file_handle(&this->m_file,file);
  local_44 = this_local._4_4_;
  local_48 = 0x200;
  local_40[0] = (uint)libtorrent::flags::operator&
                                (this_local._4_4_,
                                 (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)
                                 0x200);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_40);
  if (bVar1) {
    local_c0 = (void *)0x0;
  }
  else {
    __len = this->m_size;
    local_4c = this_local._4_4_;
    iVar3 = anon_unknown_9::mmap_prot(this_local._4_4_);
    local_50 = this_local._4_4_;
    __flags = anon_unknown_9::mmap_flags(this_local._4_4_);
    __fd = file_handle::fd(&this->m_file);
    local_c0 = mmap64((void *)0x0,__len,iVar3,__flags,__fd,0);
  }
  this->m_mapping = local_c0;
  local_58 = this_local._4_4_;
  local_5c = 0x200;
  local_54 = (uint)libtorrent::flags::operator&
                             (this_local._4_4_,
                              (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)
                              0x200);
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_54);
  bVar1 = false;
  if (!bVar2) {
    bVar1 = this->m_mapping == (void *)0xffffffffffffffff;
  }
  if (bVar1) {
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    cat = boost::system::system_category();
    boost::system::error_code::error_code((error_code *)&advise,iVar3,cat);
    local_71 = file_mmap;
    throw_ex<libtorrent::storage_error,boost::system::error_code,libtorrent::operation_t>
              ((error_code *)&advise,&local_71);
  }
  if (0 < local_28) {
    local_7c = (uint)libtorrent::flags::operator&
                               (this_local._4_4_,
                                (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)
                                0x10);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_7c);
    local_78 = 2;
    if (bVar1) {
      local_78 = 0;
    }
    local_78 = local_78 | 0x10;
    if (local_78 != 0) {
      madvise(this->m_mapping,this->m_size,local_78);
    }
  }
  return;
}

Assistant:

file_mapping::file_mapping(file_handle file, open_mode_t const mode, std::int64_t const file_size)
	: m_size(memory_map_size(mode, file_size, file))
	, m_file(std::move(file))
	, m_mapping((mode & open_mode::no_mmap) ? nullptr
		: mmap(nullptr, static_cast<std::size_t>(m_size)
			, mmap_prot(mode), mmap_flags(mode), m_file.fd(), 0))
{
	TORRENT_ASSERT(file_size >= 0);
	// you can't create an mmap of size 0, so we just set it to null. We
	// still need to create the empty file.
	if (!(mode & open_mode::no_mmap) && m_mapping == map_failed)
	{
		throw_ex<storage_error>(error_code(errno, system_category()), operation_t::file_mmap);
	}

#if TORRENT_USE_MADVISE
	if (file_size > 0)
	{
		int const advise = ((mode & open_mode::random_access) ? 0 : MADV_SEQUENTIAL)
#ifdef MADV_DONTDUMP
		// on versions of linux that support it, ask for this region to not be
		// included in coredumps (mostly to make the coredumps more manageable
		// with large disk caches)
		// ignore errors here, since this is best-effort
			| MADV_DONTDUMP
#endif
#ifdef MADV_NOCORE
		// This is the BSD counterpart to exclude a range from core dumps
			| MADV_NOCORE
#endif
		;
		if (advise != 0)
			madvise(m_mapping, static_cast<std::size_t>(m_size), advise);
	}
#endif
}